

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.c
# Opt level: O0

int X509_check_private_key(X509 *x509,EVP_PKEY *pkey)

{
  int iVar1;
  EVP_PKEY *b;
  int ret;
  EVP_PKEY *xk;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int line;
  undefined4 local_4;
  
  b = X509_get0_pubkey((X509 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (b == (EVP_PKEY *)0x0) {
    ERR_new();
    ERR_set_debug((char *)x509,(int)((ulong)pkey >> 0x20),(char *)b);
    ERR_set_error(0xb,0x6c,(char *)0x0);
    local_4 = 0;
  }
  else {
    iVar1 = EVP_PKEY_eq((EVP_PKEY *)pkey,b);
    line = (int)((ulong)pkey >> 0x20);
    if (iVar1 == -2) {
      ERR_new();
      ERR_set_debug((char *)x509,line,(char *)b);
      ERR_set_error(0xb,0x75,(char *)0x0);
    }
    else if (iVar1 == -1) {
      ERR_new();
      ERR_set_debug((char *)x509,line,(char *)b);
      ERR_set_error(0xb,0x73,(char *)0x0);
    }
    else if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug((char *)x509,line,(char *)b);
      ERR_set_error(0xb,0x74,(char *)0x0);
    }
    local_4 = (uint)(0 < iVar1);
  }
  return local_4;
}

Assistant:

int X509_check_private_key(const X509 *x, const EVP_PKEY *k)
{
    const EVP_PKEY *xk;
    int ret;

    xk = X509_get0_pubkey(x);
    if (xk == NULL) {
        ERR_raise(ERR_LIB_X509, X509_R_UNABLE_TO_GET_CERTS_PUBLIC_KEY);
        return 0;
    }

    switch (ret = EVP_PKEY_eq(xk, k)) {
    case 0:
        ERR_raise(ERR_LIB_X509, X509_R_KEY_VALUES_MISMATCH);
        break;
    case -1:
        ERR_raise(ERR_LIB_X509, X509_R_KEY_TYPE_MISMATCH);
        break;
    case -2:
        ERR_raise(ERR_LIB_X509, X509_R_UNKNOWN_KEY_TYPE);
        break;
    }

    return ret > 0;
}